

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.cc
# Opt level: O0

void CRYPTO_refcount_inc(CRYPTO_refcount_t *in_count)

{
  bool bVar1;
  uint32_t local_1c;
  uint32_t new_value;
  uint32_t expected;
  CRYPTO_atomic_u32 *count;
  CRYPTO_refcount_t *in_count_local;
  
  _new_value = (CRYPTO_atomic_u32 *)in_count;
  count = (CRYPTO_atomic_u32 *)in_count;
  local_1c = CRYPTO_atomic_load_u32((CRYPTO_atomic_u32 *)in_count);
  do {
    if (local_1c == 0xffffffff) {
      return;
    }
    bVar1 = CRYPTO_atomic_compare_exchange_weak_u32(_new_value,&local_1c,local_1c + 1);
  } while (!bVar1);
  return;
}

Assistant:

void CRYPTO_refcount_inc(CRYPTO_refcount_t *in_count) {
  CRYPTO_atomic_u32 *count = (CRYPTO_atomic_u32 *)in_count;
  uint32_t expected = CRYPTO_atomic_load_u32(count);

  while (expected != CRYPTO_REFCOUNT_MAX) {
    uint32_t new_value = expected + 1;
    if (CRYPTO_atomic_compare_exchange_weak_u32(count, &expected, new_value)) {
      break;
    }
  }
}